

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StrWriter_cpp.h
# Opt level: O0

StrWriter * __thiscall moira::StrWriter::operator<<(StrWriter *this,FRegList l)

{
  StrWriter *pSVar1;
  Fp local_58;
  Fp local_54;
  Fp local_50;
  int local_4c;
  byte local_45;
  int i_3;
  int iStack_40;
  bool first;
  int i_2;
  int i_1;
  int i;
  int r [8];
  StrWriter *this_local;
  FRegList l_local;
  
  r._24_8_ = this;
  for (i_2 = 0; i_2 < 8; i_2 = i_2 + 1) {
    (&i_1)[i_2] = (uint)(((uint)l.raw & 1 << ((byte)i_2 & 0x1f)) != 0);
  }
  for (iStack_40 = 1; iStack_40 < 8; iStack_40 = iStack_40 + 1) {
    if ((&i_1)[iStack_40] != 0) {
      (&i_1)[iStack_40] = (&i_1)[iStack_40 + -1] + 1;
    }
  }
  for (i_3 = 6; -1 < i_3; i_3 = i_3 + -1) {
    if (((&i_1)[i_3] != 0) && ((&i_1)[i_3 + 1] != 0)) {
      (&i_1)[i_3] = (&i_1)[i_3 + 1];
    }
  }
  local_45 = 1;
  for (local_4c = 0; local_4c < 8; local_4c = (&i_1)[local_4c] + 1 + local_4c) {
    if ((&i_1)[local_4c] != 0) {
      if ((local_45 & 1) == 0) {
        operator<<(this,"/");
      }
      else {
        local_45 = 0;
      }
      if ((&i_1)[local_4c] == 1) {
        Fp::Fp(&local_50,local_4c);
        operator<<(this,local_50);
      }
      else {
        Fp::Fp(&local_54,local_4c);
        pSVar1 = operator<<(this,local_54);
        pSVar1 = operator<<(pSVar1,"-");
        Fp::Fp(&local_58,local_4c + (&i_1)[local_4c] + -1);
        operator<<(pSVar1,local_58);
      }
    }
  }
  return this;
}

Assistant:

StrWriter&
StrWriter::operator<<(FRegList l)
{
    int r[8];

    // Step 1: Fill array r with the register list bits, e.g., 11101101
    for (int i = 0; i <= 7; i++) { r[i] = !!(l.raw & (1 << i)); }

    // Step 2: Convert 11101101 to 12301201
    for (int i = 1; i <= 7; i++) { if (r[i]) r[i] = r[i-1] + 1; }

    // Step 3: Convert 12301201 to 33302201
    for (int i = 6; i >= 0; i--) { if (r[i] && r[i+1]) r[i] = r[i+1]; }

    // Step 4: Convert 33302201 to "FP0-FP2/FP4/FP5/FP7"
    bool first = true;
    for (int i = 0; i <= 7; i += r[i] + 1) {

        if (r[i] == 0) continue;

        // Print delimiter
        if (first) { first = false; } else { *this << "/"; }

        // Format variant 1: Single register
        if (r[i] == 1) { *this << Fp{i}; }

        // Format variant 2: Register range
        else { *this << Fp{i} << "-" << Fp{i+r[i]-1}; }
    }

    return *this;
}